

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hxx
# Opt level: O2

void __thiscall
Plot::Plot(Plot *this,string *function,string *name,string *xlabel,string *ylabel,string *zlabel,
          int mode,int lineStyle,int lineWidth)

{
  (this->sFunction)._M_dataplus._M_p = (pointer)&(this->sFunction).field_2;
  (this->sFunction)._M_string_length = 0;
  (this->sFunction).field_2._M_local_buf[0] = '\0';
  (this->sName)._M_dataplus._M_p = (pointer)&(this->sName).field_2;
  (this->sName)._M_string_length = 0;
  (this->sName).field_2._M_local_buf[0] = '\0';
  (this->sXLabel)._M_dataplus._M_p = (pointer)&(this->sXLabel).field_2;
  (this->sXLabel)._M_string_length = 0;
  (this->sXLabel).field_2._M_local_buf[0] = '\0';
  (this->sYLabel)._M_dataplus._M_p = (pointer)&(this->sYLabel).field_2;
  (this->sYLabel)._M_string_length = 0;
  (this->sYLabel).field_2._M_local_buf[0] = '\0';
  (this->sZLabel)._M_dataplus._M_p = (pointer)&(this->sZLabel).field_2;
  (this->sZLabel)._M_string_length = 0;
  (this->sZLabel).field_2._M_local_buf[0] = '\0';
  (this->sUserSettings)._M_dataplus._M_p = (pointer)&(this->sUserSettings).field_2;
  (this->sUserSettings)._M_string_length = 0;
  (this->sUserSettings).field_2._M_local_buf[0] = '\0';
  (this->sUsedDimensions)._M_dataplus._M_p = (pointer)&(this->sUsedDimensions).field_2;
  (this->sUsedDimensions)._M_string_length = 0;
  (this->sUsedDimensions).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->sName);
  std::__cxx11::string::_M_assign((string *)&this->sXLabel);
  std::__cxx11::string::_M_assign((string *)&this->sYLabel);
  std::__cxx11::string::_M_assign((string *)&this->sZLabel);
  this->nMode = mode;
  this->nLineStyle = lineStyle;
  this->nLineWidth = lineWidth;
  return;
}

Assistant:

Plot(string function, string name, string xlabel, string ylabel, string zlabel, int mode, int lineStyle=0, int lineWidth=0) {
		sFunction = function;
		sName = name;
		sXLabel = xlabel;
		sYLabel = ylabel;
		sZLabel = zlabel;
		nMode = mode;
		nLineStyle = lineStyle;
        nLineWidth = lineWidth;
	}